

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O1

void reset_raw(Hacl_Hash_Blake2b_Simd256_state_t *state,
              K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ushort uVar3;
  undefined8 uVar4;
  Lib_IntVector_Intrinsics_vec256 *palVar5;
  uint8_t *__dest;
  uint *puVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint64_t uVar19;
  Lib_IntVector_Intrinsics_vec256 *r0;
  Hacl_Hash_Blake2b_blake2_params *pHVar20;
  ulong __n;
  undefined1 auVar21 [16];
  undefined2 local_4a;
  undefined6 uStack_48;
  
  pHVar20 = key.fst;
  uVar1 = (state->block_state).fst;
  uVar2 = (state->block_state).snd;
  uStack_48 = (undefined6)((ulong)(state->block_state).thd.fst >> 0x10);
  uVar4 = *(undefined8 *)&(state->block_state).field_0x2;
  local_4a = (undefined2)((ulong)uVar4 >> 0x30);
  palVar5 = (state->block_state).thd.snd;
  __dest = state->buf;
  __n = (ulong)pHVar20->key_length;
  if (__n != 0) {
    memset(__dest + __n,0,(ulong)(0x80 - pHVar20->key_length));
    memcpy(__dest,key.snd,__n);
  }
  puVar6 = (uint *)pHVar20->salt;
  puVar7 = pHVar20->personal;
  uVar3._0_1_ = pHVar20->node_depth;
  uVar3._1_1_ = pHVar20->inner_length;
  uVar8._0_1_ = pHVar20->digest_length;
  uVar8._1_1_ = pHVar20->key_length;
  uVar8._2_1_ = pHVar20->fanout;
  uVar8._3_1_ = pHVar20->depth;
  uVar9 = pHVar20->leaf_length;
  uVar19 = pHVar20->node_offset;
  uVar10 = *(uint *)((long)&pHVar20->node_offset + 4);
  *(undefined4 *)palVar5[2] = 0xf3bcc908;
  *(undefined4 *)((long)palVar5[2] + 4) = 0x6a09e667;
  *(undefined4 *)(palVar5[2] + 1) = 0x84caa73b;
  *(undefined4 *)((long)palVar5[2] + 0xc) = 0xbb67ae85;
  *(undefined4 *)(palVar5[2] + 2) = 0xfe94f82b;
  *(undefined4 *)((long)palVar5[2] + 0x14) = 0x3c6ef372;
  *(undefined4 *)(palVar5[2] + 3) = 0x5f1d36f1;
  *(undefined4 *)((long)palVar5[2] + 0x1c) = 0xa54ff53a;
  *(undefined4 *)palVar5[3] = 0xade682d1;
  *(undefined4 *)((long)palVar5[3] + 4) = 0x510e527f;
  *(undefined4 *)(palVar5[3] + 1) = 0x2b3e6c1f;
  *(undefined4 *)((long)palVar5[3] + 0xc) = 0x9b05688c;
  *(undefined4 *)(palVar5[3] + 2) = 0xfb41bd6b;
  *(undefined4 *)((long)palVar5[3] + 0x14) = 0x1f83d9ab;
  *(undefined4 *)(palVar5[3] + 3) = 0x137e2179;
  *(undefined4 *)((long)palVar5[3] + 0x1c) = 0x5be0cd19;
  auVar21._8_8_ = 0xa54ff53a5f1d36f1;
  auVar21._0_8_ = 0xa54ff53a5f1d36f1;
  auVar21 = vpinsrq_avx(auVar21,(ulong)uVar3 ^ 0x3c6ef372fe94f82b,0);
  uVar11 = *puVar6;
  uVar12 = puVar6[1];
  uVar13 = puVar6[2];
  uVar14 = puVar6[3];
  uVar15 = *(uint *)(puVar7 + 0x10);
  uVar16 = *(uint *)(puVar7 + 0x14);
  uVar17 = *(uint *)(puVar7 + 0x18);
  uVar18 = *(uint *)(puVar7 + 0x1c);
  *(undefined1 (*) [16])(*palVar5 + 2) = auVar21;
  *(uint *)*palVar5 = uVar8 ^ 0xf3bcc908;
  *(uint *)((long)*palVar5 + 4) = uVar9 ^ 0x6a09e667;
  *(uint *)(*palVar5 + 1) = (uint)uVar19 ^ 0x84caa73b;
  *(uint *)((long)*palVar5 + 0xc) = uVar10 ^ 0xbb67ae85;
  *(uint *)palVar5[1] = uVar11 ^ 0xade682d1;
  *(uint *)((long)palVar5[1] + 4) = uVar12 ^ 0x510e527f;
  *(uint *)(palVar5[1] + 1) = uVar13 ^ 0x2b3e6c1f;
  *(uint *)((long)palVar5[1] + 0xc) = uVar14 ^ 0x9b05688c;
  *(uint *)(palVar5[1] + 2) = uVar15 ^ 0xfb41bd6b;
  *(uint *)((long)palVar5[1] + 0x14) = uVar16 ^ 0x1f83d9ab;
  *(uint *)(palVar5[1] + 3) = uVar17 ^ 0x137e2179;
  *(uint *)((long)palVar5[1] + 0x1c) = uVar18 ^ 0x5be0cd19;
  (state->block_state).fst = uVar1;
  (state->block_state).snd = uVar2;
  (state->block_state).thd.fst = (Lib_IntVector_Intrinsics_vec256 *)CONCAT62(uStack_48,local_4a);
  *(undefined8 *)&(state->block_state).field_0x2 = uVar4;
  (state->block_state).thd.snd = palVar5;
  state->buf = __dest;
  state->total_len = (ulong)(uVar1 != '\0') << 7;
  return;
}

Assistant:

static void
reset_raw(
  Hacl_Hash_Blake2s_Simd128_state_t *state,
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key
)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  uint8_t *buf = scrut.buf;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state = scrut.block_state;
  uint8_t nn0 = block_state.snd;
  uint8_t kk10 = block_state.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk10, .digest_length = nn0 };
  KRML_MAYBE_UNUSED_VAR(i);
  Hacl_Hash_Blake2b_blake2_params *p = key.fst;
  uint8_t kk1 = p->key_length;
  uint8_t nn = p->digest_length;
  Hacl_Hash_Blake2b_index i1 = { .key_length = kk1, .digest_length = nn };
  uint32_t kk2 = (uint32_t)i1.key_length;
  uint8_t *k_1 = key.snd;
  if (!(kk2 == 0U))
  {
    uint8_t *sub_b = buf + kk2;
    memset(sub_b, 0U, (64U - kk2) * sizeof (uint8_t));
    memcpy(buf, k_1, kk2 * sizeof (uint8_t));
  }
  Hacl_Hash_Blake2b_blake2_params pv = p[0U];
  init_with_params(block_state.thd.snd, pv);
  uint8_t kk11 = i.key_length;
  uint32_t ite;
  if (kk11 != 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = 0U;
  }
  Hacl_Hash_Blake2s_Simd128_state_t
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)ite };
  state[0U] = tmp;
}